

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# various_input.cpp
# Opt level: O0

void use_get_and_getline(void)

{
  ostream *poVar1;
  char local_119;
  char local_118 [7];
  char ch;
  char input [255];
  int LIMIT;
  
  std::operator<<((ostream *)&std::cout,"Enter strings for getline() processing:\n");
  std::istream::getline((char *)&std::cin,(long)local_118,-1);
  poVar1 = std::operator<<((ostream *)&std::cout,"You input:\n");
  poVar1 = std::operator<<(poVar1,local_118);
  std::operator<<(poVar1,"\n");
  std::istream::get((char *)&std::cin);
  poVar1 = std::operator<<((ostream *)&std::cout,"The following input char is ");
  poVar1 = std::operator<<(poVar1,local_119);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (local_119 != '\n') {
    std::istream::ignore((long)&std::cin,0xff);
  }
  std::operator<<((ostream *)&std::cout,"Enter a string for get() processing:\n");
  std::istream::get((char *)&std::cin,(long)local_118,-1);
  poVar1 = std::operator<<((ostream *)&std::cout,"You input:\n");
  poVar1 = std::operator<<(poVar1,local_118);
  std::operator<<(poVar1,"\n");
  std::istream::get((char *)&std::cin);
  poVar1 = std::operator<<((ostream *)&std::cout,"The next input char is ");
  poVar1 = std::operator<<(poVar1,local_119);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void use_get_and_getline() {
    using std::cout;
    using std::cin;
    using std::endl;

    const int LIMIT = 255;

    char input[LIMIT];

    cout << "Enter strings for getline() processing:\n";
    //  '#' is what separate the line
    cin.getline(input, LIMIT, '#');
    cout << "You input:\n" << input << "\n";

    char ch;
    //  read next char. getline() abandon the '#'
    cin.get(ch);

    cout << "The following input char is " << ch << endl;
    if (ch != '\n') {
        //  read and ignore next 'LIMIT' input, util met '\n'
        cin.ignore(LIMIT, '\n');
    }

    cout << "Enter a string for get() processing:\n";
    cin.get(input, LIMIT, '#');
    cout << "You input:\n" << input << "\n";

    //  read next char. get() not abandon '#'
    cin.get(ch);
    cout << "The next input char is " << ch << endl;
}